

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O3

CURLcode Curl_client_unpause(Curl_easy *data)

{
  undefined8 *puVar1;
  byte bVar2;
  int type;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  CURLcode CVar6;
  char *optr;
  size_t olen;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  dynbuf *s;
  long lVar10;
  tempbuf writebuf [3];
  undefined8 auStack_d38 [399];
  undefined8 uStack_c0;
  long local_b0;
  dynbuf dStack_a8;
  int iStack_88;
  byte abStack_84 [84];
  
  uVar9 = (ulong)(data->state).tempcount;
  if (uVar9 == 0) {
    CVar6 = CURLE_OK;
  }
  else {
    lVar10 = 0xc90;
    uVar7 = 0;
    do {
      *(undefined8 *)((long)auStack_d38 + lVar10 + 0x20) =
           *(undefined8 *)((long)(data->last_poll).sockets + lVar10 + -0x70);
      puVar1 = (undefined8 *)((long)&data->magic + lVar10);
      uVar3 = *puVar1;
      uVar4 = puVar1[1];
      puVar1 = (undefined8 *)((long)(&data->last_poll + -4) + lVar10);
      uVar5 = puVar1[1];
      *(undefined8 *)((long)auStack_d38 + lVar10 + 0x10) = *puVar1;
      *(undefined8 *)((long)auStack_d38 + lVar10 + 0x18) = uVar5;
      *(undefined8 *)((long)auStack_d38 + lVar10) = uVar3;
      *(undefined8 *)((long)auStack_d38 + lVar10 + 8) = uVar4;
      uStack_c0 = 0x673fbe;
      Curl_dyn_init((dynbuf *)((long)&data->magic + lVar10),0x4000000);
      uVar7 = uVar7 + 1;
      lVar10 = lVar10 + 0x28;
    } while (uVar7 < (data->state).tempcount);
    (data->state).tempcount = 0;
    lVar10 = uVar9 * 0x28;
    lVar8 = 0;
    CVar6 = CURLE_OK;
    local_b0 = lVar10;
    do {
      s = (dynbuf *)((long)&dStack_a8.bufr + lVar8);
      if (CVar6 == CURLE_OK) {
        type = *(int *)((long)&iStack_88 + lVar8);
        bVar2 = abStack_84[lVar8];
        uStack_c0 = 0x674012;
        optr = Curl_dyn_ptr(s);
        uStack_c0 = 0x67401d;
        olen = Curl_dyn_len(s);
        lVar10 = local_b0;
        uStack_c0 = 0x674035;
        CVar6 = chop_write(data,type,(bVar2 & 1) == 0,optr,olen);
      }
      uStack_c0 = 0x67403f;
      Curl_dyn_free(s);
      lVar8 = lVar8 + 0x28;
    } while (lVar10 != lVar8);
  }
  return CVar6;
}

Assistant:

CURLcode Curl_client_unpause(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;

  if(data->state.tempcount) {
    /* there are buffers for sending that can be delivered as the receive
       pausing is lifted! */
    unsigned int i;
    unsigned int count = data->state.tempcount;
    struct tempbuf writebuf[3]; /* there can only be three */

    /* copy the structs to allow for immediate re-pausing */
    for(i = 0; i < data->state.tempcount; i++) {
      writebuf[i] = data->state.tempwrite[i];
      Curl_dyn_init(&data->state.tempwrite[i].b, DYN_PAUSE_BUFFER);
    }
    data->state.tempcount = 0;

    for(i = 0; i < count; i++) {
      /* even if one function returns error, this loops through and frees
         all buffers */
      if(!result)
        result = chop_write(data, writebuf[i].type,
                            !writebuf[i].paused_body,
                            Curl_dyn_ptr(&writebuf[i].b),
                            Curl_dyn_len(&writebuf[i].b));
      Curl_dyn_free(&writebuf[i].b);
    }
  }
  return result;
}